

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

string * __thiscall
Config::GetValue_abi_cxx11_(string *__return_storage_ptr__,Config *this,char *key)

{
  ushort uVar1;
  bool bVar2;
  int __val;
  Type pGVar3;
  Ch *__s;
  allocator<char> *__a;
  allocator<char> local_22;
  allocator<char> local_21;
  
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)this,key);
  if (bVar2) {
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)this,key);
    uVar1 = (pGVar3->data_).f.flags;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)this,key);
    if ((uVar1 >> 10 & 1) == 0) {
      __val = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pGVar3);
      std::__cxx11::to_string(__return_storage_ptr__,__val);
      return __return_storage_ptr__;
    }
    __s = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(pGVar3);
    __a = &local_21;
  }
  else {
    __a = &local_22;
    __s = (char *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string Config::GetValue(const char* key)
{
    if(Settings.HasMember(key))
    {
        if(Settings[key].IsString())
        {
            return Settings[key].GetString();
        }
        else
        {
            return std::to_string(Settings[key].GetInt());
        }
        
    }

    return nullptr;
}